

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PushColumnsBackground(void)

{
  ImGuiWindow *draw_list;
  ImGuiWindow *unaff_retaddr;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiColumns *pIVar1;
  
  draw_list = GetCurrentWindowRead();
  pIVar1 = (draw_list->DC).CurrentColumns;
  if (pIVar1->Count != 1) {
    (pIVar1->HostBackupClipRect).Min = (draw_list->ClipRect).Min;
    (pIVar1->HostBackupClipRect).Max = (draw_list->ClipRect).Max;
    SetWindowClipRectBeforeSetChannel(unaff_retaddr,(ImRect *)draw_list);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)unaff_retaddr,(ImDrawList *)draw_list,
               (int)((ulong)pIVar1 >> 0x20));
  }
  return;
}

Assistant:

void ImGui::PushColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    columns->HostBackupClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, columns->HostInitialClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, 0);
}